

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

float64 gauden_mixture(float64 **den,uint32 **den_idx,float32 **w,gauden_t *g)

{
  double dStack_40;
  uint32 k;
  float64 oprob;
  uint32 kk;
  uint32 j;
  float64 out;
  gauden_t *g_local;
  float32 **w_local;
  uint32 **den_idx_local;
  float64 **den_local;
  
  _kk = 1.0;
  for (oprob._4_4_ = 0; oprob._4_4_ < g->n_feat; oprob._4_4_ = oprob._4_4_ + 1) {
    dStack_40 = 0.0;
    for (oprob._0_4_ = 0; oprob._0_4_ < g->n_top; oprob._0_4_ = oprob._0_4_ + 1) {
      dStack_40 = (double)(float)w[oprob._4_4_][den_idx[oprob._4_4_][oprob._0_4_]] *
                  (double)den[oprob._4_4_][oprob._0_4_] + dStack_40;
    }
    _kk = dStack_40 * _kk;
  }
  return (float64)_kk;
}

Assistant:

float64
gauden_mixture(float64 **den,
	       uint32 **den_idx,
	       float32 **w,
	       gauden_t *g)
{
    float64 out;
    uint32 j;

    out = 1.0;
    for (j = 0; j < g->n_feat; j++) {
	uint32 kk;
	float64 oprob;

	oprob = 0;
	kk = 0;
 	while (kk < g->n_top) {
	    uint32 k;
	    k = den_idx[j][kk];
	    oprob += w[j][k] * den[j][kk];
	    ++kk;
	}

	out *= oprob;
    }

    return out;
}